

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

int h261_gob(bitstream *str,h261_gob *gob)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  bitstream *in_RSI;
  int *in_RDI;
  int k;
  int j;
  h261_macroblock *mb;
  uint32_t mba;
  uint32_t quant;
  int mbi;
  uint32_t gei;
  vs_vlc_val *in_stack_00000058;
  uint32_t *in_stack_00000060;
  bitstream *in_stack_00000068;
  uint32_t in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint local_28;
  uint intra;
  undefined4 uVar5;
  
  iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (uint32_t *)
               CONCAT17(in_stack_ffffffffffffffc7,
                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffbc);
  if (iVar1 == 0) {
    iVar1 = 0;
    iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (uint32_t *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                 in_stack_ffffffffffffffbc);
    while (iVar2 == 0) {
      if (iVar1 == 0) {
        iVar1 = 0;
        intra = *(uint *)&in_RSI->field_0x4;
        uVar5 = 0;
        do {
          local_28 = 0;
          if (*in_RDI == 0) {
            while( true ) {
              bVar4 = false;
              if (iVar1 < 0x21) {
                bVar4 = *(int *)((long)in_RSI + (long)iVar1 * 0x614 + 8) == 0;
              }
              if (bVar4 == false) break;
              iVar2 = vs_infer((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffc6,
                                                       in_stack_ffffffffffffffc0)),
                               in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
              iVar1 = iVar1 + 1;
              local_28 = local_28 + 1;
            }
            if (iVar1 == 0x21) {
              return 0;
            }
            in_stack_ffffffffffffffc7 = 0;
          }
          while( true ) {
            iVar2 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
            if (iVar2 != 0) {
              return 1;
            }
            if ((*in_RDI == 0) || (local_28 < 0x21)) break;
            if (local_28 != 0x21) {
              while( true ) {
                if (0x20 < iVar1) {
                  return 0;
                }
                *(undefined4 *)((long)in_RSI + (long)iVar1 * 0x614 + 8) = 0;
                iVar2 = vs_infer((bitstream *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (uint32_t *)
                                 CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   in_stack_ffffffffffffffc0)),
                                 in_stack_ffffffffffffffbc);
                if (iVar2 != 0) break;
                iVar1 = iVar1 + 1;
              }
              return 1;
            }
          }
          if (*in_RDI == 1) {
            for (; in_stack_ffffffffffffffc6 = iVar1 < 0x21 && local_28 != 0,
                iVar1 < 0x21 && local_28 != 0; iVar1 = iVar1 + 1) {
              *(undefined4 *)((long)in_RSI + (long)iVar1 * 0x614 + 8) = 0;
              iVar2 = vs_infer((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
              local_28 = local_28 - 1;
            }
            if (iVar1 == 0x21) {
              fprintf(_stderr,"Macroblock address overrun\n");
              return 1;
            }
          }
          puVar3 = (uint *)((long)in_RSI + (long)iVar1 * 0x614 + 8);
          iVar2 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
          if (iVar2 != 0) {
            return 1;
          }
          if ((*puVar3 & 3) != 0) {
            if ((*puVar3 & 4) == 0) {
              iVar2 = vs_infer((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              iVar2 = vs_u((bitstream *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (uint32_t *)
                           CONCAT17(in_stack_ffffffffffffffc7,
                                    CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                           in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
              intra = puVar3[1];
            }
          }
          if ((*puVar3 & 8) != 0) {
            iVar2 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
            if (iVar2 != 0) {
              return 1;
            }
          }
          if ((*puVar3 & 1) == 0) {
            if ((*puVar3 & 2) == 0) {
              iVar2 = vs_infer((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              iVar2 = vs_infer((bitstream *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (uint32_t *)
                               CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffbc);
              if (iVar2 != 0) {
                return 1;
              }
            }
          }
          else {
            iVar2 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
            if (iVar2 != 0) {
              return 1;
            }
          }
          for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < 6;
              in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
            if ((puVar3[4] & 1 << ((byte)in_stack_ffffffffffffffcc & 0x1f)) == 0) {
              for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < 0x40;
                  in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
                iVar2 = vs_infers((bitstream *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                  (int32_t *)
                                  CONCAT17(in_stack_ffffffffffffffc7,
                                           CONCAT16(in_stack_ffffffffffffffc6,
                                                    in_stack_ffffffffffffffc0)),
                                  in_stack_ffffffffffffffbc);
                if (iVar2 != 0) {
                  return 1;
                }
              }
            }
            else {
              iVar2 = h261_block(in_RSI,(int32_t *)CONCAT44(uVar5,iVar1),intra);
              if (iVar2 != 0) {
                return 1;
              }
            }
          }
          iVar1 = iVar1 + 1;
        } while( true );
      }
      iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint32_t *)
                   CONCAT17(in_stack_ffffffffffffffc7,
                            CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                   in_stack_ffffffffffffffbc);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint32_t *)
                   CONCAT17(in_stack_ffffffffffffffc7,
                            CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                   in_stack_ffffffffffffffbc);
    }
  }
  return 1;
}

Assistant:

int h261_gob(struct bitstream *str, struct h261_gob *gob) {
	if (vs_u(str, &gob->gquant, 5)) return 1;
	uint32_t gei = 0;
	if (vs_u(str, &gei, 1)) return 1;
	while (gei) {
		if (vs_u(str, &gei, 8)) return 1;
		if (vs_u(str, &gei, 1)) return 1;
	}
	int mbi = 0;
	uint32_t quant = gob->gquant;
	while (1) {
		uint32_t mba = 0;
		if (str->dir == VS_ENCODE) {
			while (mbi < H261_GOB_MBS && gob->mbs[mbi].mtype == 0) {
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba++;
			}
		       	if (mbi == H261_GOB_MBS)
				return 0;
		}
		while (1) {
			if (vs_vlc(str, &mba, mba_vlc)) return 1;
			if (str->dir == VS_ENCODE || mba < 33)
				break;
			if (mba == 33) /* stuffing */
				continue;
			/* end */
			while (mbi < H261_GOB_MBS) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++;
			}
			return 0;
		}
		if (str->dir == VS_DECODE) {
			while (mbi < H261_GOB_MBS && mba) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba--;
			}
			if (mbi == H261_GOB_MBS) {
				fprintf(stderr, "Macroblock address overrun\n");
				return 1;
			}
		}
		struct h261_macroblock *mb = &gob->mbs[mbi];
		if (vs_vlc(str, &mb->mtype, mtype_vlc)) return 1;
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA)) {
			if (mb->mtype & H261_MTYPE_FLAG_QUANT) {
				if (vs_u(str, &mb->mquant, 5)) return 1;
				quant = mb->mquant;
			} else {
				if (vs_infer(str, &mb->mquant, quant)) return 1;
			}
		}
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			if (vs_vlc(str, &mb->mvd[0], mvd_vlc)) return 1;
			if (vs_vlc(str, &mb->mvd[1], mvd_vlc)) return 1;
		}
		if (mb->mtype & H261_MTYPE_FLAG_CODED) {
			if (vs_vlc(str, &mb->cbp, cbp_vlc)) return 1;
		} else if (mb->mtype & H261_MTYPE_FLAG_INTRA) {
			if (vs_infer(str, &mb->cbp, 0x3f)) return 1;
		} else {
			if (vs_infer(str, &mb->cbp, 0)) return 1;
		}
		int j, k;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				if (h261_block(str, mb->block[j], mb->mtype & H261_MTYPE_FLAG_INTRA)) return 1;
			} else {
				for (k = 0; k < 64; k++)
					if (vs_infers(str, &mb->block[j][k], 0)) return 1;
			}
		}
		mbi++;
	}
	return 0;
}